

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

RawClassRef stackjit::Runtime::newString(char *string,int length)

{
  VMState *pVVar1;
  GarbageCollector *pGVar2;
  ArrayType *arrayType;
  RawArrayRef value;
  ClassType *classType;
  RawClassRef stringRef;
  RawClassRef stringPr;
  int i;
  RawArrayRef charsPtr;
  int length_local;
  char *string_local;
  
  pVVar1 = vmState();
  pGVar2 = VMState::gc(pVVar1);
  arrayType = StringRef::charArrayType();
  value = GarbageCollector::newArray(pGVar2,arrayType,length);
  for (stringPr._4_4_ = 0; stringPr._4_4_ < length; stringPr._4_4_ = stringPr._4_4_ + 1) {
    value[stringPr._4_4_ + 4] = string[stringPr._4_4_];
  }
  pVVar1 = vmState();
  pGVar2 = VMState::gc(pVVar1);
  classType = StringRef::stringType();
  stringRef = GarbageCollector::newClass(pGVar2,classType);
  StringRef::setCharsField(stringRef,(char *)value);
  return stringRef;
}

Assistant:

RawClassRef Runtime::newString(const char* string, int length) {
		//Allocate the underlying char array
		auto charsPtr = vmState()->gc().newArray(StringRef::charArrayType(), length);

		//Set the value for the char array
		for (int i = 0; i < length; i++) {
			charsPtr[i + stackjit::ARRAY_LENGTH_SIZE] = (unsigned char)string[i];
		}

		//Allocate the string object
		auto stringPr = vmState()->gc().newClass(StringRef::stringType());

		//Set the chars field
		StringRef::setCharsField(stringPr, (char*)charsPtr);
		return stringPr;
	}